

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O3

int __thiscall pstore::file::unlink(file *this,char *__name)

{
  int err;
  uint uVar1;
  int *piVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  uVar1 = ::unlink(*(char **)this);
  piVar2 = (int *)(ulong)uVar1;
  if (uVar1 == 0xffffffff) {
    piVar2 = __errno_location();
    err = *piVar2;
    if (((char)__name == '\0') || (err != 2)) {
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_38,*(long *)this,*(long *)(this + 8) + *(long *)this);
      (anonymous_namespace)::raise_file_error<char_const*,std::__cxx11::string>
                (err,"unlink failed",&local_38);
    }
  }
  return (int)piVar2;
}

Assistant:

void unlink (std::string const & path, bool const allow_noent) {
            if (::unlink (path.c_str ()) == -1) {
                int const err = errno;
                if (!allow_noent || err != ENOENT) {
                    raise_file_error (err, "unlink failed", path);
                }
            }
        }